

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph.cpp
# Opt level: O1

vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> * __thiscall
duckdb::QueryGraphEdges::GetConnections
          (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *__return_storage_ptr__,
          QueryGraphEdges *this,JoinRelationSet *node,JoinRelationSet *other)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_20 = ::std::
               _Function_handler<bool_(duckdb::NeighborInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/query_graph.cpp:131:27)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<bool_(duckdb::NeighborInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/query_graph.cpp:131:27)>
             ::_M_manager;
  local_38._M_unused._M_object = other;
  local_38._8_8_ = __return_storage_ptr__;
  EnumerateNeighbors(this,node,(function<bool_(duckdb::NeighborInfo_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<reference<NeighborInfo>> QueryGraphEdges::GetConnections(JoinRelationSet &node,
                                                                      JoinRelationSet &other) const {
	vector<reference<NeighborInfo>> connections;
	EnumerateNeighbors(node, [&](NeighborInfo &info) -> bool {
		if (JoinRelationSet::IsSubset(other, *info.neighbor)) {
			connections.push_back(info);
		}
		return false;
	});
	return connections;
}